

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

int4 __thiscall
ParamListStandard::characterizeAsParam(ParamListStandard *this,Address *loc,int4 size)

{
  pointer pprVar1;
  rangemap<ParamEntryRange> *this_00;
  ParamEntry *this_01;
  bool bVar2;
  int4 iVar3;
  ulong uVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  int4 iVar7;
  pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator> pVar8;
  
  uVar4 = (ulong)loc->base->index;
  pprVar1 = (this->resolverMap).
            super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = 0;
  if ((uVar4 < (ulong)((long)(this->resolverMap).
                             super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pprVar1 >> 3)) &&
     (this_00 = pprVar1[uVar4], this_00 != (rangemap<ParamEntryRange> *)0x0)) {
    pVar8 = rangemap<ParamEntryRange>::find(this_00,loc->offset);
    iVar7 = 0;
    for (cVar5._M_node = (_Base_ptr)pVar8.first.iter._M_node;
        (const_iterator)cVar5._M_node != pVar8.second.iter._M_node.iter;
        cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node)) {
      this_01 = (ParamEntry *)cVar5._M_node[2]._M_parent[1]._M_parent;
      if ((this_01->minsize <= size) &&
         (iVar3 = ParamEntry::justifiedContain(this_01,loc,size), iVar3 == 0)) {
        return 1;
      }
      bVar2 = ParamEntry::containedBy(this_01,loc,size);
      if (bVar2) {
        iVar7 = 2;
      }
    }
    if (iVar7 == 2) {
LAB_00291f81:
      iVar7 = 2;
    }
    else if (pVar8.second.iter._M_node.iter !=
             (const_iterator)&(this_00->tree)._M_t._M_impl.super__Rb_tree_header) {
      cVar6 = rangemap<ParamEntryRange>::find_end(this_00,((long)size + loc->offset) - 1);
      for (; (const_iterator)cVar5._M_node != cVar6.iter._M_node;
          cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node)) {
        bVar2 = ParamEntry::containedBy
                          ((ParamEntry *)cVar5._M_node[2]._M_parent[1]._M_parent,loc,size);
        if (bVar2) goto LAB_00291f81;
      }
    }
  }
  return iVar7;
}

Assistant:

int4 ParamListStandard::characterizeAsParam(const Address &loc,int4 size) const

{
  int4 index = loc.getSpace()->getIndex();
  if (index >= resolverMap.size())
    return 0;
  ParamEntryResolver *resolver = resolverMap[index];
  if (resolver == (ParamEntryResolver *)0)
    return 0;
  pair<ParamEntryResolver::const_iterator,ParamEntryResolver::const_iterator> iterpair;
  iterpair = resolver->find(loc.getOffset());
  int4 res = 0;
  while(iterpair.first != iterpair.second) {
    const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
    if (testEntry->getMinSize() <= size && testEntry->justifiedContain(loc, size)==0)
      return 1;
    if (testEntry->containedBy(loc, size))
      res = 2;
    ++iterpair.first;
  }
  if (res != 2 && iterpair.first != resolver->end()) {
    iterpair.second = resolver->find_end(loc.getOffset() + (size-1));
    while(iterpair.first != iterpair.second) {
      const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
      if (testEntry->containedBy(loc, size)) {
	res = 2;
	break;
      }
      ++iterpair.first;
    }
  }
  return res;
}